

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo
          (RpcConnectionState *this,Reader *disembargo)

{
  ReadLimiter **ppRVar1;
  HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *this_00;
  ushort uVar2;
  uint uVar3;
  uint *puVar4;
  Embargo *pEVar5;
  int *piVar6;
  PromiseArena *pPVar7;
  PromiseFulfiller<void> *pPVar8;
  Disposer *pDVar9;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *pEVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  Promise<void> PVar13;
  SegmentBuilder *node;
  PointerType PVar14;
  SegmentReader *pSVar15;
  Entry *pEVar16;
  ArrayDisposer *pAVar17;
  ulong uVar18;
  int iVar19;
  _func_int **pp_Var20;
  short sVar21;
  uint uVar22;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *this_01;
  unsigned_short uVar23;
  CapTableReader *pCVar24;
  Disposer *disposerCopy;
  bool bVar25;
  ArrayPtr<const_unsigned_char> value;
  Own<capnp::ClientHook,_std::nullptr_t> target;
  void *continuationTracePtr;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> nextMsg;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:4183:19),_void>
  promise;
  Fault f;
  Fault f_1;
  undefined1 local_148 [16];
  WirePointer *local_138;
  anon_union_16_1_a8a2e026_for_OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>_2
  local_130;
  undefined1 local_118 [56];
  Promise<void> local_e0 [2];
  PointerBuilder local_d0;
  undefined1 local_b8 [48];
  StructBuilder local_88;
  StructBuilder local_58;
  
  puVar4 = (uint *)(disembargo->_reader).data;
  uVar3 = (disembargo->_reader).dataSize;
  if (uVar3 < 0x30) {
    sVar21 = 0;
  }
  else {
    sVar21 = (short)puVar4[1];
  }
  pSVar15 = (disembargo->_reader).segment;
  local_118._8_8_ = (disembargo->_reader).capTable;
  local_118._16_8_ = (disembargo->_reader).pointers;
  uVar2 = (disembargo->_reader).pointerCount;
  local_118._24_4_ = (disembargo->_reader).nestingLimit;
  if (sVar21 != 2) {
    if (sVar21 == 1) {
      uVar22 = 0;
      if (0x1f < uVar3) {
        uVar22 = *puVar4;
      }
      local_118._0_4_ = uVar22;
      if ((int)uVar22 < 0) {
        kj::
        Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
        ::find<0ul,unsigned_int&>
                  ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
                    *)local_b8,(uint *)&(this->embargoes).highSlots);
        pSVar15 = (SegmentReader *)local_b8._0_8_;
        if ((SegmentReader *)local_b8._0_8_ != (SegmentReader *)0x0) {
          pSVar15 = (SegmentReader *)(local_b8._0_8_ + 8);
        }
      }
      else {
        uVar18 = (ulong)uVar22;
        pEVar5 = (this->embargoes).slots.builder.ptr;
        if ((uVar18 < (ulong)((long)(this->embargoes).slots.builder.pos - (long)pEVar5 >> 4)) &&
           (pEVar5[uVar18].fulfiller.ptr.ptr != (PromiseFulfiller<void> *)0x0)) {
          pSVar15 = (SegmentReader *)(pEVar5 + uVar18);
        }
        else {
          pSVar15 = (SegmentReader *)0x0;
        }
      }
      if (pSVar15 != (SegmentReader *)0x0) {
        if ((PromiseArena *)(((Embargo *)&pSVar15->id)->fulfiller).ptr.disposer ==
            (PromiseArena *)0x0) {
          local_118._0_8_ = (SegmentReader *)0x0;
          local_b8._0_8_ = (SegmentReader *)0x0;
          local_b8._8_8_ = (CapTableReader *)0x0;
          kj::_::Debug::Fault::init
                    ((Fault *)local_118,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)local_118);
        }
        pPVar7 = (PromiseArena *)(((Embargo *)&pSVar15->id)->fulfiller).ptr.disposer;
        (*((PromiseRejector *)pPVar7->bytes)->_vptr_PromiseRejector[2])(pPVar7,local_b8);
        local_148._0_4_ = 0;
        if (0x1f < uVar3) {
          local_148._0_4_ = *puVar4;
        }
        if ((int)local_148._0_4_ < 0) {
          this_00 = &(this->embargoes).highSlots;
          kj::
          Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
          ::find<0ul,unsigned_int&>
                    ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
                      *)local_b8,(uint *)this_00);
          if ((SegmentReader *)local_b8._0_8_ == (SegmentReader *)0x0) {
            local_118._0_8_ = (SegmentReader *)0x0;
            local_b8._0_8_ = (SegmentReader *)0x0;
            local_b8._8_8_ = (CapTableReader *)0x0;
            kj::_::Debug::Fault::init
                      ((Fault *)local_118,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                      );
            kj::_::Debug::Fault::fatal((Fault *)local_118);
          }
          kj::
          Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>_>
          ::release((Entry *)local_b8,&this_00->table,(Entry *)local_b8._0_8_);
        }
        else {
          pEVar5 = (this->embargoes).slots.builder.ptr;
          pCVar24 = (CapTableReader *)pEVar5[(uint)local_148._0_4_].fulfiller.ptr.disposer;
          pPVar8 = pEVar5[(uint)local_148._0_4_].fulfiller.ptr.ptr;
          pEVar5[(uint)local_148._0_4_].fulfiller.ptr.disposer = (Disposer *)0x0;
          pEVar5[(uint)local_148._0_4_].fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
          std::
          priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
          ::push(&(this->embargoes).freeIds,(value_type *)local_148);
          local_b8._8_8_ = pCVar24;
          local_b8._16_8_ = pPVar8;
        }
        if ((PromiseFulfiller<void> *)local_b8._16_8_ != (PromiseFulfiller<void> *)0x0) {
          (**((CapTableReader *)local_b8._8_8_)->_vptr_CapTableReader)
                    (local_b8._8_8_,
                     (_func_int *)
                     ((long)&(((PromiseFulfiller<void> *)local_b8._16_8_)->super_PromiseRejector).
                             _vptr_PromiseRejector +
                     (long)(((PromiseFulfiller<void> *)local_b8._16_8_)->super_PromiseRejector).
                           _vptr_PromiseRejector[-2]));
        }
        checkIfBecameIdle(this);
        return;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                ((Fault *)local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x1093,FAILED,(char *)0x0,
                 "\"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.\"",
                 (char (*) [61])"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.");
      kj::_::Debug::Fault::fatal((Fault *)local_b8);
    }
    if (sVar21 != 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[31],capnp::rpc::Disembargo::Reader_const&>
                ((Fault *)local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x10e9,FAILED,(char *)0x0,"\"Unimplemented Disembargo type.\", disembargo",
                 (char (*) [31])"Unimplemented Disembargo type.",disembargo);
      kj::_::Debug::Fault::fatal((Fault *)local_b8);
    }
    uVar22 = 0;
    if (uVar2 == 0) {
      local_118._24_4_ = 0x7fffffff;
      local_118._8_8_ = (CapTableReader *)0x0;
      local_118._16_8_ = (WirePointer *)0x0;
      pSVar15 = (SegmentReader *)0x0;
    }
    local_118._0_8_ = pSVar15;
    PointerReader::getStruct((StructReader *)local_b8,(PointerReader *)local_118,(word *)0x0);
    getMessageTarget((RpcConnectionState *)local_148,(Reader *)this);
    if (0x1f < uVar3) {
      uVar22 = *puVar4;
    }
    ClientHook::whenResolved((ClientHook *)local_b8);
    kj::Promise<void>::
    then<capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::_lambda()_1_>
              ((Promise<void> *)&local_d0,(anon_class_1_0_00000001_for_func *)local_b8);
    uVar12 = local_b8._0_8_;
    if ((SegmentReader *)local_b8._0_8_ != (SegmentReader *)0x0) {
      local_b8._0_8_ = (SegmentReader *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar12);
    }
    local_b8._8_4_ = uVar22;
    local_b8._16_8_ = local_148._0_8_;
    local_b8._24_8_ = local_148._8_8_;
    local_148._8_8_ = 0;
    local_118._0_8_ =
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:4189:32)>
         ::anon_class_32_3_62e1cf96_for_func::operator();
    local_b8._0_8_ = this;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::SimpleTransformPromiseNode<void,capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::_lambda()_2_>,kj::_::PromiseDisposer,capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::_lambda()_2_,void*&>
              ((PromiseDisposer *)&local_88,(OwnPromiseNode *)&local_d0,
               (anon_class_32_3_62e1cf96_for_func *)local_b8,(void **)local_118);
    local_e0[0].super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_88.segment;
    kj::TaskSet::add(&this->tasks,local_e0);
    PVar13.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_e0[0];
    if (local_e0[0].super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
      local_e0[0].super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar13.super_PromiseBase.node.ptr);
    }
    uVar12 = local_b8._24_8_;
    if ((WirePointer *)local_b8._24_8_ != (WirePointer *)0x0) {
      local_b8._24_8_ = (WirePointer *)0x0;
      (**(code **)*(_func_int **)local_b8._16_8_)
                (local_b8._16_8_,uVar12 + *(long *)((long)*(WirePointer *)uVar12 + -0x10));
    }
    node = local_d0.segment;
    if (local_d0.segment != (SegmentBuilder *)0x0) {
      local_d0.segment = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
    uVar12 = local_148._8_8_;
    if ((_func_int **)local_148._8_8_ == (_func_int **)0x0) {
      return;
    }
    local_148._8_8_ = 0;
    (**(code **)*(_func_int **)local_148._0_8_)
              (local_148._0_8_,uVar12 + *(long *)(*(_func_int **)uVar12 + -0x10));
    return;
  }
  iVar19 = 0x7fffffff;
  if (uVar2 < 2) {
    local_118._8_8_ = (CapTableReader *)0x0;
    local_b8._16_8_ = (WirePointer *)0x0;
    pSVar15 = (SegmentReader *)0x0;
    local_118._24_4_ = 0x7fffffff;
  }
  else {
    local_b8._16_8_ = local_118._16_8_ + 8;
  }
  local_b8._24_4_ = local_118._24_4_;
  pCVar24 = (CapTableReader *)0x0;
  local_b8._0_8_ = pSVar15;
  local_b8._8_8_ = local_118._8_8_;
  value = (ArrayPtr<const_unsigned_char>)
          PointerReader::getBlob<capnp::Data>((PointerReader *)local_b8,(void *)0x0,0);
  local_118._16_8_ = (WirePointer *)0x0;
  local_118._0_8_ = (SegmentReader *)0x0;
  if ((disembargo->_reader).pointerCount != 0) {
    local_118._0_8_ = (disembargo->_reader).segment;
    pCVar24 = (disembargo->_reader).capTable;
    local_118._16_8_ = (disembargo->_reader).pointers;
    iVar19 = (disembargo->_reader).nestingLimit;
  }
  local_118._24_4_ = iVar19;
  uVar23 = 0;
  local_118._8_8_ = pCVar24;
  PointerReader::getStruct((StructReader *)local_b8,(PointerReader *)local_118,(word *)0x0);
  if (0x2f < (uint)local_b8._32_4_) {
    uVar23 = (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_b8._16_8_ + 4))->structRef).
             dataSize.value;
  }
  if (uVar23 == 1) {
    local_148._8_8_ = local_b8._8_8_;
    local_138 = (WirePointer *)local_b8._24_8_;
    local_148._0_8_ = local_b8._0_8_;
    if (local_b8._36_2_ == 0) {
      local_b8._40_4_ = 0x7fffffff;
      local_148._8_8_ = (CapTableReader *)0x0;
      local_138 = (WirePointer *)0x0;
      local_148._0_8_ = (SegmentReader *)0x0;
    }
    local_130._0_4_ = local_b8._40_4_;
    PointerReader::getStruct((StructReader *)local_118,(PointerReader *)local_148,(word *)0x0);
    if (local_118._36_2_ == 0) {
      local_148._0_8_ = (SegmentReader *)0x0;
      local_148._8_8_ = (CapTableReader *)0x0;
      local_138 = (WirePointer *)0x0;
      local_130._0_4_ = 0x7fffffff;
    }
    else {
      local_148._0_8_ = local_118._0_8_;
      local_148._8_8_ = local_118._8_8_;
      local_138 = (WirePointer *)local_118._24_8_;
      local_130._0_4_ = local_118._40_4_;
    }
    PVar14 = PointerReader::getPointerType((PointerReader *)local_148);
    local_88.segment = (SegmentBuilder *)CONCAT71(local_88.segment._1_7_,PVar14 == NULL_);
    if (PVar14 != NULL_) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[70]>
                ((Fault *)local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x10d0,FAILED,"!promisedAnswer.hasTransform()",
                 "_kjCondition,\"Disembargo sent to Provide operation cannot include a transformation.\""
                 ,(DebugExpression<bool> *)&local_88,
                 (char (*) [70])
                 "Disembargo sent to Provide operation cannot include a transformation.");
      kj::_::Debug::Fault::fatal((Fault *)local_148);
    }
    anon_unknown_18::ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>
    ::find((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *)
           local_148,(int)this + 0x2d8);
    if ((SegmentReader *)local_148._0_8_ == (SegmentReader *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
                ((Fault *)local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x10d3,FAILED,"answers.find(promisedAnswer.getQuestionId()) != nullptr",
                 "\"Disembargo specified a provision ID (question ID) that doesn\'t exist.\"",
                 (char (*) [70])
                 "Disembargo specified a provision ID (question ID) that doesn\'t exist.");
      kj::_::Debug::Fault::fatal((Fault *)local_148);
    }
    if (*(int *)&((ArrayPtr<const_capnp::word> *)(local_148._0_8_ + 0x10))->ptr == 4) {
      ppRVar1 = (ReadLimiter **)(local_148._0_8_ + 0x20);
      if ((int)(*ppRVar1)[2].limit == 1) {
        local_148 = (undefined1  [16])value;
        local_88.segment = (SegmentBuilder *)local_148;
        pEVar16 = kj::
                  Table<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,kj::HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>>
                  ::
                  FindOrCreateImpl<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide::findOrCreateThirdPartyEmbargo(kj::ArrayPtr<unsigned_char_const>)::{lambda()#1},kj::ArrayPtr<unsigned_char_const>&>
                  ::apply<0ul>((Table<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>::Callbacks>_>
                                *)(*ppRVar1 + 5),(StringPtr *)local_148,
                               (anon_class_8_1_3fcf65d9_conflict *)&local_88);
        pDVar9 = pEVar16[1].value.disposer;
        (*pDVar9->_vptr_Disposer[2])(pDVar9,local_148);
        return;
      }
      local_88.segment = (SegmentBuilder *)0x0;
      local_148 = ZEXT816(0);
      kj::_::Debug::Fault::init
                ((Fault *)&local_88,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_88);
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[78]>
              ((Fault *)local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x10d6,FAILED,"answer.task.tryGet<Answer::Provide>() != nullptr",
               "\"Disembargo specified a question ID that didn\'t belong to a Provide operation.\"",
               (char (*) [78])
               "Disembargo specified a question ID that didn\'t belong to a Provide operation.");
    kj::_::Debug::Fault::fatal((Fault *)local_148);
  }
  if (uVar23 != 0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,char_const(&)[29],capnp::rpc::MessageTarget::Reader&>
              ((Fault *)local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x10e2,FAILED,(char *)0x0,"\"Unknown message target type.\", target",
               (char (*) [29])"Unknown message target type.",(Reader *)local_b8);
    kj::_::Debug::Fault::fatal((Fault *)local_118);
  }
  this_01 = (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)
            local_118;
  anon_unknown_18::ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::
  find(this_01,(int)this + 0x1b8);
  if ((SegmentReader *)local_118._0_8_ == (SegmentReader *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
              ((Fault *)local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x109f,FAILED,"exports.find(target.getImportedCap()) != nullptr",
               "\"Message target is not a current export ID.\"",
               (char (*) [43])"Message target is not a current export ID.");
    kj::_::Debug::Fault::fatal((Fault *)local_118);
  }
  if (*(long *)&((SegmentId *)(local_118._0_8_ + 0x30))->value == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
              ((Fault *)local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x10a1,FAILED,"exp.vineInfo != nullptr","\"Disembargo target is not a vine.\"",
               (char (*) [33])"Disembargo target is not a vine.");
    kj::_::Debug::Fault::fatal((Fault *)local_118);
  }
  piVar6 = *(int **)&((SegmentId *)(local_118._0_8_ + 0x30))->value;
  iVar19 = *piVar6;
  if (iVar19 == 2) {
    pEVar10 = (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)
              ((ArrayPtr<const_capnp::word> *)(local_118._0_8_ + 0x10))->ptr;
    this_01 = (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)0x0;
    if ((pEVar10->slots).builder.pos ==
        (RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Export> *)(this->brand).ptr) {
      this_01 = pEVar10;
    }
    if (this_01 ==
        (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)0x0) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_148._8_8_;
      local_148 = auVar11 << 0x40;
      local_118._0_8_ = (SegmentReader *)0x0;
      local_118._8_8_ = (CapTableReader *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)local_148,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)local_148);
    }
    pAVar17 = (ArrayDisposer *)
              (this_01->freeIds).c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    iVar19 = 1;
LAB_00346492:
    if (*(int *)&pAVar17[4]._vptr_ArrayDisposer == 1) {
      pp_Var20 = pAVar17[7]._vptr_ArrayDisposer;
      goto LAB_003464aa;
    }
  }
  else {
    if (iVar19 != 1) {
      iVar19 = -1;
      pp_Var20 = (_func_int **)0x0;
      goto LAB_003464aa;
    }
    this_01 = *(ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> **)
               (piVar6 + 4);
    pAVar17 = (this_01->slots).builder.disposer;
    iVar19 = 0;
    if (pAVar17 != (ArrayDisposer *)0x0) goto LAB_00346492;
  }
  pp_Var20 = (_func_int **)0x0;
LAB_003464aa:
  if (pp_Var20 != (_func_int **)0x0) {
    (**(code **)*pp_Var20)(local_e0,pp_Var20,(int)(value.size_ >> 3) + 0x1b);
    (*(code *)**(undefined8 **)local_e0[1].super_PromiseBase.node.ptr)(&local_d0);
    local_88.data = local_d0.pointer;
    local_88.segment = local_d0.segment;
    local_88.capTable = local_d0.capTable;
    PointerBuilder::initStruct
              ((StructBuilder *)local_118,(PointerBuilder *)&local_88,(StructSize)0x10001);
    *(undefined2 *)local_118._16_8_ = 0xd;
    local_88.segment = (SegmentBuilder *)local_118._0_8_;
    local_88.capTable = (CapTableBuilder *)local_118._8_8_;
    local_88.data = (void *)local_118._24_8_;
    PointerBuilder::initStruct
              ((StructBuilder *)local_148,(PointerBuilder *)&local_88,(StructSize)0x20001);
    (local_138->field_1).structRef.dataSize.value = 2;
    local_118._16_8_ = CONCAT44(local_130._4_4_,local_130._0_4_) + 8;
    local_118._0_8_ = local_148._0_8_;
    local_118._8_8_ = local_148._8_8_;
    PointerBuilder::setBlob<capnp::Data>((PointerBuilder *)local_118,(Reader)value);
    if (iVar19 == 0) {
      local_d0.segment = (SegmentBuilder *)local_148._0_8_;
      local_d0.capTable = (CapTableBuilder *)local_148._8_8_;
      PointerBuilder::initStruct(&local_88,&local_d0,(StructSize)0x10001);
      ((char *)((long)local_88.data + 4))[0] = '\x01';
      ((char *)((long)local_88.data + 4))[1] = '\0';
      local_d0.segment = local_88.segment;
      local_d0.capTable = local_88.capTable;
      local_d0.pointer = local_88.pointers;
      PointerBuilder::initStruct((StructBuilder *)local_118,&local_d0,(StructSize)0x10001);
      *(undefined4 *)local_118._16_8_ =
           *(undefined4 *)
            &(this_01->freeIds).c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    }
    else if (iVar19 == 1) {
      local_88.data = (void *)CONCAT44(local_130._4_4_,local_130._0_4_);
      local_88.segment = (SegmentBuilder *)local_148._0_8_;
      local_88.capTable = (CapTableBuilder *)local_148._8_8_;
      PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_88,(StructSize)0x10001);
      (**(code **)&(this_01->slots).builder.ptr[1].resolveOp.ptr)(&local_d0,this_01);
      bVar25 = &(local_d0.capTable)->super_CapTableReader == (CapTableReader *)0x0;
      local_118._0_8_ = local_d0.segment;
      local_118._8_8_ = local_d0.capTable;
      local_118._16_8_ = &kj::none;
      local_118._24_8_ = " == ";
      local_118._32_8_ = 5;
      local_118[0x28] = bVar25;
      local_d0.capTable = (CapTableBuilder *)0x0;
      if (!bVar25) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,decltype(nullptr)>>,kj::None_const&>&>
                  ((Fault *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x10c0,FAILED,"import->writeTarget(nextDisembargo.initTarget()) == kj::none",
                   "_kjCondition,",
                   (DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_const_kj::None_&>
                    *)local_118);
        kj::_::Debug::Fault::fatal((Fault *)&local_88);
      }
    }
    (**(code **)(*(long *)local_e0[1].super_PromiseBase.node.ptr + 0x10))();
    PVar13.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_e0[1];
    if (local_e0[1].super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
      local_e0[1].super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
      (*(code *)**(undefined8 **)local_e0[0].super_PromiseBase.node.ptr)
                (local_e0[0].super_PromiseBase.node.ptr,
                 (long)PVar13.super_PromiseBase.node.ptr +
                 *(long *)(*(long *)PVar13.super_PromiseBase.node.ptr + -0x10));
    }
  }
  return;
}

Assistant:

void handleDisembargo(const rpc::Disembargo::Reader& disembargo) {
    auto context = disembargo.getContext();
    switch (context.which()) {
      case rpc::Disembargo::Context::SENDER_LOOPBACK: {
        kj::Own<ClientHook> target = getMessageTarget(disembargo.getTarget());

        EmbargoId embargoId = context.getSenderLoopback();

        // It's possible that `target` is a promise capability that hasn't resolved yet, in which
        // case we must wait for the resolution. In particular this can happen in the case where
        // we have Alice -> Bob -> Carol, Alice makes a call that proxies from Bob to Carol, and
        // Carol returns a capability from this call that points all the way back though Bob to
        // Alice. When this return capability passes through Bob, Bob will resolve the previous
        // promise-pipeline capability to it. However, Bob has to send a Disembargo to Carol before
        // completing this resolution. In the meantime, though, Bob returns the final response to
        // Alice. Alice then *also* sends a Disembargo to Bob. The Alice -> Bob Disembargo might
        // arrive at Bob before the Bob -> Carol Disembargo has resolved, in which case the
        // Disembargo is delivered to a promise capability.
        auto promise = target->whenResolved()
            .then([]() {
          // We also need to insert yieldUntilQueueEmpty() here to make sure that any pending calls
          // towards this cap have had time to find their way through the event loop.
          return kj::yieldUntilQueueEmpty();
        });

        tasks.add(promise.then([this, embargoId, target = kj::mv(target)]() mutable {
          for (;;) {
            KJ_IF_SOME(r, target->getResolved()) {
              target = r.addRef();
            } else {
              break;
            }
          }

          KJ_REQUIRE(unwrapIfSameConnection(*target) != kj::none,
                    "'Disembargo' of type 'senderLoopback' sent to an object that does not point "
                    "back to the sender.") {
            return;
          }

          if (!connection.is<Connected>()) {
            return;
          }

          RpcClient& downcasted = kj::downcast<RpcClient>(*target);

          auto message = connection.get<Connected>().connection->newOutgoingMessage(
              messageSizeHint<rpc::Disembargo>() + MESSAGE_TARGET_SIZE_HINT);
          auto builder = message->getBody().initAs<rpc::Message>().initDisembargo();

          {
            auto redirect = downcasted.writeTarget(builder.initTarget());

            // Disembargoes should only be sent to capabilities that were previously the subject of
            // a `Resolve` message.  But `writeTarget` only ever returns non-null when called on
            // a PromiseClient.  The code which sends `Resolve` and `Return` should have replaced
            // any promise with a direct node in order to solve the Tribble 4-way race condition.
            // See the documentation of Disembargo in rpc.capnp for more.
            KJ_REQUIRE(redirect == kj::none,
                      "'Disembargo' of type 'senderLoopback' sent to an object that does not "
                      "appear to have been the subject of a previous 'Resolve' message.") {
              return;
            }
          }

          builder.getContext().setReceiverLoopback(embargoId);

          message->send();
        }));

        break;
      }

      case rpc::Disembargo::Context::RECEIVER_LOOPBACK: {
        KJ_IF_SOME(embargo, embargoes.find(context.getReceiverLoopback())) {
          KJ_ASSERT_NONNULL(embargo.fulfiller)->fulfill();
          embargoes.erase(context.getReceiverLoopback(), embargo);
          checkIfBecameIdle();
        } else {
          KJ_FAIL_REQUIRE("Invalid embargo ID in 'Disembargo.context.receiverLoopback'.");
        }
        break;
      }